

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::Context::applyCommandLine(Context *this,int argc,char **argv)

{
  int in_ESI;
  String *in_RDI;
  bool in_stack_0000025f;
  char **in_stack_00000260;
  int in_stack_0000026c;
  Context *in_stack_00000270;
  String *in_stack_ffffffffffffffc0;
  
  parseArgs(in_stack_00000270,in_stack_0000026c,in_stack_00000260,in_stack_0000025f);
  if (in_ESI != 0) {
    String::String(in_stack_ffffffffffffffc0,(char *)in_RDI);
    String::operator=(in_stack_ffffffffffffffc0,in_RDI);
    String::~String(in_stack_ffffffffffffffc0);
  }
  return;
}

Assistant:

void Context::applyCommandLine(int argc, const char* const* argv) {
    parseArgs(argc, argv);
    if(argc)
        p->binary_name = argv[0];
}